

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

PropResult __thiscall
Clasp::ClauseHead::propagate(ClauseHead *this,Solver *s,Literal p,uint32 *param_3)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  bool bVar8;
  Antecedent local_38;
  
  uVar3 = p.rep_ & 0xfffffffe ^ 2;
  uVar7 = this->head_[1].rep_ ^ uVar3;
  bVar8 = uVar7 < 2;
  uVar5 = this->head_[!bVar8].rep_;
  puVar1 = (s->assign_).assign_.ebo_.buf;
  uVar6 = 0x100;
  uVar4 = 1;
  if ((byte)(*(byte *)((long)puVar1 + (ulong)(uVar5 & 0xfffffffc)) & 3) !=
      (byte)(2U - ((uVar5 & 2) == 0))) {
    uVar5 = this->head_[2].rep_;
    local_38.data_ = (uint64)this;
    if ((byte)(*(byte *)((long)puVar1 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
        (byte)(((uVar5 & 2) == 0) + 1U)) {
      iVar2 = (*(this->super_Constraint)._vptr_Constraint[0x17])(this,s,(ulong)bVar8);
      if ((char)iVar2 == '\0') {
        bVar8 = Solver::force(s,this->head_ + (bVar8 ^ 1),&local_38);
        uVar4 = (ushort)bVar8;
        goto LAB_0016337a;
      }
      uVar5 = this->head_[uVar7 < 2].rep_;
    }
    else {
      this->head_[uVar7 < 2].rep_ = uVar5;
      this->head_[2].rep_ = uVar3;
    }
    Solver::addWatch(s,(Literal)(uVar5 & 0xfffffffe ^ 2),(ClauseWatch *)&local_38);
    uVar6 = 0;
  }
LAB_0016337a:
  return (PropResult)(uVar6 | uVar4);
}

Assistant:

Constraint::PropResult ClauseHead::propagate(Solver& s, Literal p, uint32&) {
	Literal* head = head_;
	uint32 wLit   = (head[1] == ~p); // pos of false watched literal
	if (s.isTrue(head[1-wLit])) {
		return Constraint::PropResult(true, true);
	}
	else if (!s.isFalse(head[2])) {
		assert(!isSentinel(head[2]) && "Invalid ClauseHead!");
		head[wLit] = head[2];
		head[2]    = ~p;
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	else if (updateWatch(s, wLit)) {
		assert(!s.isFalse(head_[wLit]));
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	return PropResult(s.force(head_[1^wLit], this), true);
}